

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionZ.cpp
# Opt level: O0

void __thiscall
OpenMD::PositionZ::PositionZ
          (PositionZ *this,SimInfo *info,string *filename,string *sele,int nzbins,int axis)

{
  undefined1 uVar1;
  string *in_RCX;
  SimInfo *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R9D;
  SimInfo *in_stack_00000178;
  SelectionManager *in_stack_00000180;
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  StaticAnalyser *in_stack_fffffffffffffee0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  undefined8 *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  SelectionEvaluator *this_00;
  string *script;
  SelectionEvaluator *this_01;
  string local_c0 [32];
  string local_a0 [36];
  undefined4 local_7c;
  double *local_78;
  double *local_70;
  undefined4 local_64;
  double *local_60;
  double *local_58;
  SimInfo *in_stack_ffffffffffffffc8;
  SelectionEvaluator *in_stack_ffffffffffffffd0;
  
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffee0,(SimInfo *)in_stack_fffffffffffffed8._M_current,
             (string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffecc);
  *in_RDI = &PTR__PositionZ_005608b0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),in_RCX);
  SelectionEvaluator::SelectionEvaluator(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_01 = (SelectionEvaluator *)(in_RDI + 0xc9);
  SelectionManager::SelectionManager(in_stack_00000180,in_stack_00000178);
  Thermo::Thermo((Thermo *)(in_RDI + 0xe2),in_RSI);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1ff28b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1ff2a1);
  this_00 = (SelectionEvaluator *)(in_RDI + 0xe9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1ff2b7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1ff2cd);
  *(undefined4 *)(in_RDI + 0xef) = in_R9D;
  script = (string *)(in_RDI + 0xf0);
  std::__cxx11::string::string((string *)script);
  SelectionEvaluator::loadScriptString(this_01,script);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
  if (!(bool)uVar1) {
    in_stack_fffffffffffffee8 = in_RDI + 0xc9;
    SelectionEvaluator::evaluate(this_00);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffee0,
               (SelectionSet *)in_stack_fffffffffffffed8._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x1ff37a);
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffef0),
             (size_type)in_stack_fffffffffffffee8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffef0),
             (size_type)in_stack_fffffffffffffee8);
  __first._M_current = (double *)(in_RDI + 0xe3);
  local_58 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_60 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_64 = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (__first,in_stack_fffffffffffffed8,
             (int *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  __last._M_current = (double *)(in_RDI + 0xe6);
  local_70 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_78 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_7c = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (__first,__last,(int *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffef0),
             (size_type)in_stack_fffffffffffffee8);
  iVar2 = *(int *)(in_RDI + 0xef);
  if (iVar2 == 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xf0),"x");
  }
  else if (iVar2 == 1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xf0),"y");
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xf0),"z");
  }
  getPrefix((string *)__last._M_current);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __last._M_current,(char *)CONCAT44(iVar2,in_stack_fffffffffffffed0));
  StaticAnalyser::setOutputName
            ((StaticAnalyser *)CONCAT44(iVar2,in_stack_fffffffffffffed0),
             (string *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  return;
}

Assistant:

PositionZ::PositionZ(SimInfo* info, const std::string& filename,
                       const std::string& sele, int nzbins, int axis) :
      StaticAnalyser(info, filename, nzbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), thermo_(info),
      axis_(axis) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // fixed number of bins

    sliceSDCount_.resize(nBins_);
    flucSliceSDCount_.resize(nBins_);
    std::fill(sliceSDCount_.begin(), sliceSDCount_.end(), 0);
    std::fill(flucSliceSDCount_.begin(), flucSliceSDCount_.end(), 0);

    positionZ_.resize(nBins_);

    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      break;
    case 1:
      axisLabel_ = "y";
      break;
    case 2:
    default:
      axisLabel_ = "z";
      break;
    }

    setOutputName(getPrefix(filename) + ".CountZ");
  }